

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O1

void Mvc_CoverMakeTautology(Mvc_Cover_t *pCover)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Mvc_Cube_t *pMVar4;
  Mvc_Cube_t *pMVar5;
  byte bVar6;
  
  Mvc_CoverMakeEmpty(pCover);
  pMVar4 = Mvc_CubeAlloc(pCover);
  uVar2 = *(uint *)&pMVar4->field_0x8;
  uVar3 = uVar2 & 0xffffff;
  bVar6 = (byte)(uVar2 >> 0x18);
  if ((ulong)uVar3 == 1) {
    pMVar4->pData[0] = 0xffffffff;
    *(uint *)&pMVar4->field_0x14 = 0xffffffff >> (bVar6 & 0x1f);
  }
  else if (uVar3 == 0) {
    pMVar4->pData[0] = 0xffffffff >> (bVar6 & 0x1f);
  }
  else {
    pMVar4->pData[uVar3] = 0xffffffff >> (bVar6 & 0x1f);
    memset(pMVar4->pData,0xff,(ulong)((uVar2 & 0xffffff) << 2));
  }
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    pMVar5 = (Mvc_Cube_t *)&pCover->lCubes;
  }
  else {
    pMVar5 = (pCover->lCubes).pTail;
  }
  pMVar5->pNext = pMVar4;
  (pCover->lCubes).pTail = pMVar4;
  pMVar4->pNext = (Mvc_Cube_t *)0x0;
  piVar1 = &(pCover->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Mvc_CoverMakeTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCubeNew;
    Mvc_CoverMakeEmpty( pCover );
    pCubeNew = Mvc_CubeAlloc( pCover );
    Mvc_CubeBitFill( pCubeNew );
    Mvc_CoverAddCubeTail( pCover, pCubeNew );
}